

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise1d.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise1D::forward
          (DeconvolutionDepthWise1D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_t _elemsize;
  int *piVar5;
  int iVar6;
  long lVar7;
  Option *opt_00;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  Allocator *local_78;
  int local_60;
  size_t local_58;
  
  iVar6 = bottom_blob->w;
  iVar1 = this->kernel_w;
  iVar2 = this->dilation_w;
  _elemsize = bottom_blob->elemsize;
  iVar3 = this->stride_w;
  iVar4 = this->output_pad_right;
  local_58 = 0;
  opt_00 = (Option *)0x0;
  uStack_90 = 0;
  uStack_8c = 0;
  local_78 = (Allocator *)0x0;
  local_60 = 0;
  lVar7 = 0x10;
  if ((((this->pad_left < 1) && (this->pad_right < 1)) && (this->output_w < 1)) &&
     (lVar7 = 8, (Mat *)&stack0xffffffffffffff68 != top_blob)) {
    piVar5 = top_blob->refcount;
    if (piVar5 != (int *)0x0) {
      LOCK();
      *piVar5 = *piVar5 + 1;
      UNLOCK();
    }
    opt_00 = (Option *)top_blob->data;
    uStack_90 = SUB84(top_blob->refcount,0);
    uStack_8c = (undefined4)((ulong)top_blob->refcount >> 0x20);
    local_78 = top_blob->allocator;
    local_60 = top_blob->c;
    local_58 = top_blob->cstep;
  }
  Mat::create((Mat *)&stack0xffffffffffffff68,
              iVar4 + (iVar1 + -1) * iVar2 + (iVar6 + -1) * iVar3 + 1,this->num_output,_elemsize,
              *(Allocator **)(&opt->lightmode + lVar7));
  if ((opt_00 != (Option *)0x0) && ((long)local_60 * local_58 != 0)) {
    deconvolutiondepthwise1d
              (bottom_blob,(Mat *)&stack0xffffffffffffff68,&this->weight_data,&this->bias_data,
               this->kernel_w,this->stride_w,this->dilation_w,this->group,this->activation_type,
               &this->activation_params,opt_00);
    cut_padding(this,(Mat *)&stack0xffffffffffffff68,top_blob,opt);
    if ((top_blob->data != (void *)0x0) && (iVar6 = 0, (long)top_blob->c * top_blob->cstep != 0))
    goto LAB_004eecaa;
  }
  iVar6 = -100;
LAB_004eecaa:
  piVar5 = (int *)CONCAT44(uStack_8c,uStack_90);
  if (piVar5 != (int *)0x0) {
    LOCK();
    *piVar5 = *piVar5 + -1;
    UNLOCK();
    if (*piVar5 == 0) {
      if (local_78 == (Allocator *)0x0) {
        free(opt_00);
      }
      else {
        (*local_78->_vptr_Allocator[3])();
      }
    }
  }
  return iVar6;
}

Assistant:

int DeconvolutionDepthWise1D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || output_w > 0)
    {
        top_blob_bordered.create(outw, num_output, elemsize, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, num_output, elemsize, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    int ret = deconvolutiondepthwise1d(bottom_blob, top_blob_bordered, weight_data, bias_data, kernel_w, stride_w, dilation_w, group, activation_type, activation_params, opt);
    if (ret != 0)
        return ret;

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}